

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte bVar3;
  pointer pcVar4;
  byte *pbVar5;
  ulong uVar6;
  pointer pcVar7;
  _Alloc_hider __s;
  char cVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t __n_00;
  ulong uVar15;
  size_type __size;
  byte bVar16;
  char *__data;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  size_type __n;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  size_type *local_c8;
  size_type local_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  path local_98;
  size_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  byte *local_60;
  size_type local_58;
  byte local_50;
  undefined1 uStack_4f;
  undefined6 uStack_4e;
  error_code local_40;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_e8._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
  local_98._M_pathname._M_dataplus._M_p = local_e8._M_dataplus._M_p + commandline->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_a8);
  commandline->_M_string_length = local_a8._M_len - (long)(commandline->_M_dataplus)._M_p;
  *(undefined1 *)local_a8._M_len = 0;
  _Var9 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar4 = (commandline->_M_dataplus)._M_p;
  if (pcVar4 + commandline->_M_string_length == _Var9._M_current) {
    commandline->_M_string_length = 0;
    *pcVar4 = '\0';
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,0,
               (long)_Var9._M_current - (long)pcVar4);
  }
  uVar15 = 0xffffffffffffffff;
  if (1 < commandline->_M_string_length) {
    pcVar4 = (commandline->_M_dataplus)._M_p;
    pvVar10 = memchr(pcVar4 + 1,0x20,commandline->_M_string_length - 1);
    uVar15 = -(ulong)(pvVar10 == (void *)0x0) | (long)pvVar10 - (long)pcVar4;
  }
  local_68 = &__return_storage_ptr__->second;
  do {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,0,
               uVar15);
    __s._M_p = local_e8._M_dataplus._M_p;
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)::std::_V2::system_category();
    local_a8._M_len = strlen(__s._M_p);
    local_a8._M_str = __s._M_p;
    ::std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_98,&local_a8,auto_format);
    cVar8 = ::std::filesystem::status(&local_98,&local_40);
    std::filesystem::__cxx11::path::~path(&local_98);
    if (local_40._M_value == 0) {
      bVar16 = 1;
      if ((byte)(cVar8 + 1U) < 4) {
        bVar16 = 4 >> (cVar8 + 1U & 0xf);
      }
    }
    else {
      bVar16 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar16 & 1) != 0) goto LAB_002619c0;
    uVar15 = uVar15 + 1;
    pbVar5 = (byte *)(commandline->_M_dataplus)._M_p;
    uVar6 = commandline->_M_string_length;
  } while (((uVar15 <= uVar6 && uVar6 - uVar15 != 0) &&
           (pvVar10 = memchr(pbVar5 + uVar15,0x20,uVar6 - uVar15), pvVar10 != (void *)0x0)) &&
          (uVar15 = (long)pvVar10 - (long)pbVar5, uVar15 != 0xffffffffffffffff));
  bVar16 = *pbVar5;
  if ((bVar16 - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(bVar16 - 0x22) & 0x3f) & 1) != 0))
  {
    uVar15 = 0xffffffffffffffff;
    if (uVar6 < 2) goto LAB_002619c0;
    local_70 = uVar6 - 1;
    pvVar10 = memchr(pbVar5 + 1,(uint)bVar16,local_70);
    lVar11 = (long)pvVar10 - (long)pbVar5;
    __n_00 = local_70;
    if (lVar11 != -1 && pvVar10 != (void *)0x0) {
      bVar2 = pbVar5[lVar11 + -1];
      bVar3 = bVar2;
      while (local_70 = __n_00, bVar3 == 0x5c) {
        uVar12 = lVar11 + 1;
        if (uVar6 < uVar12 || uVar6 - uVar12 == 0) {
          if (uVar6 < 2) goto LAB_002619c0;
          goto LAB_002619a8;
        }
        pvVar10 = memchr(pbVar5 + uVar12,(uint)bVar16,uVar6 - uVar12);
        __n_00 = local_70;
        if ((pvVar10 == (void *)0x0) || (lVar11 = (long)pvVar10 - (long)pbVar5, lVar11 == -1))
        goto LAB_002619a8;
        bVar3 = pbVar5[lVar11 + -1];
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,1,
                 lVar11 - 1);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      paVar1 = &local_98._M_pathname.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_pathname._M_dataplus._M_p,
                        local_98._M_pathname.field_2._M_allocated_capacity + 1);
      }
      uVar15 = lVar11 + 1;
      if (bVar2 == 0x5c) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar7 = (__return_storage_ptr__->first)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar7,
                   pcVar7 + (__return_storage_ptr__->first)._M_string_length);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"\\","");
        pbVar13 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace_aux(&local_e8,local_e8._M_string_length,0,1,bVar16);
        local_c8 = (size_type *)(pbVar13->_M_dataplus)._M_p;
        paVar14 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8 == paVar14) {
          local_b8 = paVar14->_M_allocated_capacity;
          uStack_b0 = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          local_c8 = &local_b8;
        }
        else {
          local_b8 = paVar14->_M_allocated_capacity;
        }
        local_c0 = pbVar13->_M_string_length;
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        local_58 = 1;
        uStack_4f = 0;
        local_60 = &local_50;
        local_50 = bVar16;
        __pos = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&local_108,(char *)local_c8,0,local_c0);
        if (__pos != 0xffffffffffffffff) {
          do {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace(&local_108,__pos,local_c0,(char *)local_60,local_58);
            __pos = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              (&local_108,(char *)local_c8,__pos + local_58,local_c0);
          } while (__pos != 0xffffffffffffffff);
        }
        paVar14 = &local_108.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p == paVar14) {
          local_98._M_pathname.field_2._8_8_ = local_108.field_2._8_8_;
          local_98._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98._M_pathname._M_dataplus._M_p = local_108._M_dataplus._M_p;
        }
        local_98._M_pathname.field_2._M_allocated_capacity._1_7_ =
             local_108.field_2._M_allocated_capacity._1_7_;
        local_98._M_pathname.field_2._M_local_buf[0] = local_108.field_2._M_local_buf[0];
        local_98._M_pathname._M_string_length = local_108._M_string_length;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        local_108._M_dataplus._M_p = (pointer)paVar14;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&__return_storage_ptr__->first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_pathname._M_dataplus._M_p,
                          local_98._M_pathname.field_2._M_allocated_capacity + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT62(uStack_4e,CONCAT11(uStack_4f,local_50)) + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar14) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_002619c0;
    }
  }
  else {
    uVar15 = 0xffffffffffffffff;
    if (uVar6 < 2) goto LAB_002619c0;
    __n_00 = uVar6 - 1;
  }
LAB_002619a8:
  pvVar10 = memchr(pbVar5 + 1,0x20,__n_00);
  uVar15 = -(ulong)(pvVar10 == (void *)0x0) | (long)pvVar10 - (long)pbVar5;
LAB_002619c0:
  pbVar13 = local_68;
  if ((__return_storage_ptr__->first)._M_string_length == 0) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,0,
               uVar15);
    split_program_name();
    local_e8._M_dataplus._M_p = (__return_storage_ptr__->first)._M_dataplus._M_p;
    local_98._M_pathname._M_dataplus._M_p =
         local_e8._M_dataplus._M_p + (__return_storage_ptr__->first)._M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_a8,&local_98);
    (__return_storage_ptr__->first)._M_string_length =
         local_a8._M_len - (long)(__return_storage_ptr__->first)._M_dataplus._M_p;
    *(undefined1 *)local_a8._M_len = 0;
  }
  if (uVar15 < commandline->_M_string_length - 1) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commandline,
               uVar15 + 1,0xffffffffffffffff);
  }
  else {
    local_98._M_pathname._M_dataplus._M_p = (pointer)&local_98._M_pathname.field_2;
    local_98._M_pathname._M_string_length = 0;
    local_98._M_pathname.field_2._M_allocated_capacity =
         local_98._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  }
  split_program_name();
  _Var9 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar7 = (__return_storage_ptr__->second)._M_dataplus._M_p;
  if (pcVar7 + (__return_storage_ptr__->second)._M_string_length == _Var9._M_current) {
    (__return_storage_ptr__->second)._M_string_length = 0;
    *pcVar7 = '\0';
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (pbVar13,0,(long)_Var9._M_current - (long)pcVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}